

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint uVar1;
  uint32_t nn;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  uint32_t hmask;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint32_t hbits;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint32_t i;
  uint32_t total;
  int iVar11;
  uint32_t na;
  ulong uVar12;
  Node *node;
  ulong uVar13;
  uint32_t bins [28];
  uint32_t local_a8 [30];
  
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  uVar1 = t->asize;
  iVar11 = 0;
  iVar5 = 0;
  if (uVar1 != 0) {
    lVar4 = 0;
    uVar12 = 0;
    iVar5 = 0;
    do {
      uVar6 = 2 << ((byte)lVar4 & 0x1f);
      uVar10 = (uint)uVar12;
      if ((uVar1 <= uVar6) && (uVar6 = uVar1 - 1, uVar1 - 1 < uVar10)) break;
      iVar7 = 0;
      if (uVar10 <= uVar6) {
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (uint)(*(int *)((ulong)(t->array).ptr32 + 4 + uVar12 * 8) != -1);
          uVar9 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar9;
        } while (uVar9 <= uVar6);
        uVar12 = (ulong)(uVar10 + 1);
        if (uVar10 + 1 <= uVar6 + 1) {
          uVar12 = (ulong)(uVar6 + 1);
        }
      }
      local_a8[lVar4] = local_a8[lVar4] + iVar7;
      iVar5 = iVar5 + iVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1c);
  }
  uVar13 = (ulong)(t->node).ptr32;
  uVar1 = t->hmask;
  iVar7 = 0;
  uVar12 = 0;
  do {
    if (*(int *)(uVar13 + 4 + uVar12 * 0x18) != -1) {
      uVar2 = countint((cTValue *)(uVar13 + uVar12 * 0x18 + 8),local_a8);
      iVar7 = iVar7 + uVar2;
      iVar11 = iVar11 + 1;
    }
    uVar6 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar6;
  } while (uVar6 <= uVar1);
  uVar2 = countint(ek,local_a8);
  iVar3 = uVar2 + iVar7 + iVar5;
  hbits = 0;
  iVar7 = 0;
  uVar2 = 0;
  uVar1 = iVar3 * 2;
  if (uVar1 != 0) {
    uVar6 = 0;
    uVar10 = 1;
    uVar2 = 0;
    iVar7 = 0;
    iVar8 = 0;
    do {
      if (local_a8[uVar6] != 0) {
        iVar8 = iVar8 + local_a8[uVar6];
        if (uVar10 < (uint)(iVar8 * 2)) {
          uVar2 = (2 << ((byte)uVar6 & 0x1f)) + 1;
          iVar7 = iVar8;
        }
      }
      uVar6 = uVar6 + 1;
      uVar10 = 1 << ((byte)uVar6 & 0x1f);
    } while ((uVar10 < uVar1) && (iVar8 != iVar3));
  }
  iVar7 = (iVar5 + iVar11 + 1) - iVar7;
  if ((iVar7 != 0) && (hbits = 1, iVar7 != 1)) {
    uVar1 = 0x1f;
    if (iVar7 - 1U != 0) {
      for (; iVar7 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    hbits = (uVar1 ^ 0xffffffe0) + 0x21;
  }
  resizetab(L,t,uVar2,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  resizetab(L, t, asize, hsize2hbits(total));
}